

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

Interpolation
deqp::gles31::Functional::anon_unknown_0::getGluInterpolation(VaryingInterpolation interpolation)

{
  Interpolation local_c;
  VaryingInterpolation interpolation_local;
  
  switch(interpolation) {
  case VARYINGINTERPOLATION_SMOOTH:
    local_c = INTERPOLATION_SMOOTH;
    break;
  case VARYINGINTERPOLATION_FLAT:
    local_c = INTERPOLATION_FLAT;
    break;
  case VARYINGINTERPOLATION_CENTROID:
    local_c = INTERPOLATION_CENTROID;
    break;
  case VARYINGINTERPOLATION_DEFAULT:
    local_c = INTERPOLATION_LAST;
    break;
  default:
    local_c = INTERPOLATION_LAST;
  }
  return local_c;
}

Assistant:

glu::Interpolation getGluInterpolation (VaryingInterpolation interpolation)
{
	switch (interpolation)
	{
		case VARYINGINTERPOLATION_SMOOTH:	return glu::INTERPOLATION_SMOOTH;
		case VARYINGINTERPOLATION_FLAT:		return glu::INTERPOLATION_FLAT;
		case VARYINGINTERPOLATION_CENTROID:	return glu::INTERPOLATION_CENTROID;
		case VARYINGINTERPOLATION_DEFAULT:	return glu::INTERPOLATION_LAST;		//!< Last means no qualifier, i.e. default
		default:
			DE_FATAL("Invalid interpolation");
			return glu::INTERPOLATION_LAST;
	}
}